

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O3

void FIX::double_conversion::BiggestPowerTen
               (uint32_t number,int number_bits,uint32_t *power,int *exponent_plus_one)

{
  int iVar1;
  
  if (number >> ((byte)(number_bits + 1) & 0x1f) == 0) {
    iVar1 = (number_bits + 1) * 0x4d1 >> 0xc;
    if (*(uint *)(kSmallPowersOfTen + (long)iVar1 * 4 + 4) <= number) {
      iVar1 = iVar1 + 1;
    }
    *power = *(uint32_t *)(kSmallPowersOfTen + (long)iVar1 * 4);
    *exponent_plus_one = iVar1;
    return;
  }
  __assert_fail("number < (1u << (number_bits + 1))",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                ,0xf4,
                "void FIX::double_conversion::BiggestPowerTen(uint32_t, int, uint32_t *, int *)");
}

Assistant:

static void BiggestPowerTen(uint32_t number,
                            int number_bits,
                            uint32_t* power,
                            int* exponent_plus_one) {
  ASSERT(number < (1u << (number_bits + 1)));
  // 1233/4096 is approximately 1/lg(10).
  int exponent_plus_one_guess = ((number_bits + 1) * 1233 >> 12);
  // We increment to skip over the first entry in the kPowersOf10 table.
  // Note: kPowersOf10[i] == 10^(i-1).
  exponent_plus_one_guess++;
  // We don't have any guarantees that 2^number_bits <= number.
  if (number < kSmallPowersOfTen[exponent_plus_one_guess]) {
    exponent_plus_one_guess--;
  }
  *power = kSmallPowersOfTen[exponent_plus_one_guess];
  *exponent_plus_one = exponent_plus_one_guess;
}